

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_left_predictor_8x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  int iVar1;
  ushort uVar2;
  short sVar5;
  ushort uVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar3 [16];
  short sVar9;
  undefined1 auVar4 [16];
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar10 [16];
  short sVar14;
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  short sVar15;
  short sVar17;
  short sVar18;
  short sVar20;
  
  auVar3 = *(undefined1 (*) [16])left;
  auVar4 = *(undefined1 (*) [16])(left + 8);
  sVar15 = auVar3._8_2_;
  auVar16._0_2_ = sVar15 + auVar3._0_2_;
  sVar8 = auVar3._10_2_;
  auVar16._2_2_ = sVar8 + auVar3._2_2_;
  sVar17 = auVar3._12_2_;
  auVar16._4_2_ = sVar17 + auVar3._4_2_;
  sVar9 = auVar3._14_2_;
  auVar16._6_2_ = sVar9 + auVar3._6_2_;
  auVar16._8_2_ = sVar15;
  auVar16._10_2_ = sVar8;
  auVar16._12_2_ = sVar17;
  auVar16._14_2_ = sVar9;
  auVar3 = pshuflw(auVar3,auVar16,0xe);
  sVar5 = auVar3._2_2_ + auVar16._2_2_;
  sVar7 = auVar3._6_2_ + auVar16._6_2_;
  sVar8 = auVar3._10_2_ + sVar8;
  sVar9 = auVar3._14_2_ + sVar9;
  sVar18 = auVar4._8_2_;
  auVar19._0_2_ = sVar18 + auVar4._0_2_;
  sVar13 = auVar4._10_2_;
  auVar19._2_2_ = sVar13 + auVar4._2_2_;
  sVar20 = auVar4._12_2_;
  auVar19._4_2_ = sVar20 + auVar4._4_2_;
  sVar14 = auVar4._14_2_;
  auVar19._6_2_ = sVar14 + auVar4._6_2_;
  auVar19._8_2_ = sVar18;
  auVar19._10_2_ = sVar13;
  auVar19._12_2_ = sVar20;
  auVar19._14_2_ = sVar14;
  auVar10 = pshuflw(auVar4,auVar19,0xe);
  sVar11 = auVar10._2_2_ + auVar19._2_2_;
  sVar12 = auVar10._6_2_ + auVar19._6_2_;
  sVar13 = auVar10._10_2_ + sVar13;
  sVar14 = auVar10._14_2_ + sVar14;
  auVar4._2_2_ = sVar5 + sVar11;
  auVar4._6_2_ = sVar7 + sVar12;
  auVar4._10_2_ = sVar8 + sVar13;
  auVar4._14_2_ = sVar9 + sVar14;
  auVar4._0_2_ = auVar3._0_2_ + auVar16._0_2_ + auVar10._0_2_ + auVar19._0_2_ + sVar5 + sVar11 + 8;
  auVar4._4_2_ = auVar3._4_2_ + auVar16._4_2_ + auVar10._4_2_ + auVar19._4_2_ + sVar7 + sVar12 + 8;
  auVar4._8_2_ = auVar3._8_2_ + sVar15 + auVar10._8_2_ + sVar18 + sVar8 + sVar13 + 8;
  auVar4._12_2_ = auVar3._12_2_ + sVar17 + auVar10._12_2_ + sVar20 + sVar9 + sVar14 + 8;
  auVar3 = pshuflw(auVar4,auVar4,0);
  uVar2 = auVar3._0_2_;
  uVar6 = auVar3._2_2_;
  iVar1 = 0x10;
  do {
    *dst = uVar2 >> 4;
    dst[1] = uVar6 >> 4;
    dst[2] = uVar2 >> 4;
    dst[3] = uVar6 >> 4;
    dst[4] = uVar2 >> 4;
    dst[5] = uVar6 >> 4;
    dst[6] = uVar2 >> 4;
    dst[7] = uVar6 >> 4;
    dst = dst + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_8x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd) {
  const __m128i eight = _mm_cvtsi32_si128(8);
  const __m128i sum = dc_sum_16(left);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, eight), 4);
  (void)above;
  (void)bd;
  dc_store_8xh(dst, stride, 16, &dc);
}